

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O2

bool bgui::anon_unknown_8::isImageRowEmpty(ImageU8 *image,long k)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = image->depth;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; lVar5 = image->width, uVar3 != uVar4; uVar3 = uVar3 + 1) {
    while (0 < lVar5) {
      lVar2 = lVar5 + -1;
      lVar5 = lVar5 + -1;
      if (image->img[uVar3][k][lVar2] != '\0') goto LAB_00120c69;
    }
  }
LAB_00120c69:
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

bool isImageRowEmpty(const gimage::ImageU8 &image, long k)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long i=image.getWidth()-1; i>=0; i--)
    {
      if (image.get(i, k, d) != 0)
      {
        return false;
      }
    }
  }

  return true;
}